

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bbdpre.c
# Opt level: O0

int CVBBDPrecGetWorkSpace(void *cvode_mem,long *lenrwBBDP,long *leniwBBDP)

{
  long lVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  CVodeMem in_RDI;
  CVBBDPrecData pdata;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x175,"CVBBDPrecGetWorkSpace",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,0x17d,"CVBBDPrecGetWorkSpace",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,
                   "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                  );
    local_4 = -2;
  }
  else if (*(long *)((long)in_RDI->cv_lmem + 0xf0) == 0) {
    cvProcessError(in_RDI,-5,0x185,"CVBBDPrecGetWorkSpace",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,"BBD peconditioner memory is NULL. CVBBDPrecInit must be called.");
    local_4 = -5;
  }
  else {
    lVar1 = *(long *)((long)in_RDI->cv_lmem + 0xf0);
    *in_RSI = *(undefined8 *)(lVar1 + 0x80);
    *in_RDX = *(undefined8 *)(lVar1 + 0x88);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVBBDPrecGetWorkSpace(void* cvode_mem, long int* lenrwBBDP,
                          long int* leniwBBDP)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBBDPrecData pdata;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  if (cvls_mem->P_data == NULL)
  {
    cvProcessError(cv_mem, CVLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_PMEM_NULL);
    return (CVLS_PMEM_NULL);
  }
  pdata = (CVBBDPrecData)cvls_mem->P_data;

  *lenrwBBDP = pdata->rpwsize;
  *leniwBBDP = pdata->ipwsize;

  return (CVLS_SUCCESS);
}